

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::init
          (ConcurrentImageAtomicCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  reference pvVar6;
  ShaderProgram *pSVar7;
  ProgramSources *pPVar8;
  TestLog *pTVar9;
  TestError *pTVar10;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  ScopedLogSection local_490;
  ScopedLogSection section_1;
  string local_480;
  ShaderSource local_460;
  ProgramSources local_438;
  undefined1 local_362;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  ScopedLogSection local_2f0;
  ScopedLogSection section;
  string local_2e0;
  ShaderSource local_2c0;
  ProgramSources local_298;
  undefined1 local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_199;
  string local_198;
  ShaderSource local_178;
  ProgramSources local_150;
  value_type_conflict2 local_7c;
  int local_78;
  deUint32 buffer;
  int ndx;
  deUint32 local_50;
  ContextType local_4c;
  undefined1 local_45;
  bool supportsES32;
  allocator<unsigned_int> local_35;
  value_type_conflict2 local_34;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  Functions *gl;
  ConcurrentImageAtomicCase *this_local;
  
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  iVar3 = this->m_workSize;
  local_34 = 0;
  std::allocator<unsigned_int>::allocator(&local_35);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,(long)(iVar3 * iVar3),
             &local_34,&local_35);
  std::allocator<unsigned_int>::~allocator(&local_35);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  local_4c.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  local_50 = (deUint32)glu::ApiType::es(3,2);
  local_45 = glu::contextSupports(local_4c,(ApiType)local_50);
  if (!(bool)local_45) {
    this_00 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_shader_image_atomic");
    if (!bVar2) {
      buffer._2_1_ = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ndx,"Test requires GL_OES_shader_image_atomic",
                 (allocator<char> *)((long)&buffer + 3));
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)&ndx);
      buffer._2_1_ = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x1be))(1,&this->m_imageID);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x2e))(0xde1,this->m_imageID);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x4e0))(0xde1,1,0x8236,this->m_workSize);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x4d8))(0xde1,0x2801,0x2600);
  (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x4d8))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xa5c);
  for (local_78 = 0; local_78 < this->m_numCalls; local_78 = local_78 + 1) {
    local_7c = 0;
    (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x1b2))(1,&local_7c);
    (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x10))(0x90d2,local_7c);
    pcVar1 = *(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x54);
    iVar3 = this->m_workSize;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0);
    (*pcVar1)(0x90d2,(long)iVar3 * (long)iVar3 * 4,pvVar6,0x88ea);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_intermediateResultBuffers,&local_7c);
    dVar4 = (**(code **)(zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"gen buffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0xa69);
  }
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  local_199 = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_150);
  (anonymous_namespace)::ConcurrentImageAtomicCase::genComputeSource_abi_cxx11_(&local_198,this);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_178,&local_198);
  pPVar8 = glu::ProgramSources::operator<<(&local_150,&local_178);
  glu::ShaderProgram::ShaderProgram(pSVar7,pRVar5,pPVar8);
  local_199 = 0;
  this->m_program = pSVar7;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  glu::ProgramSources::~ProgramSources(&local_150);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,this->m_program);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    local_1c2 = 1;
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"could not build program",&local_1c1);
    tcu::TestError::TestError(pTVar10,&local_1c0);
    local_1c2 = 0;
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  section.m_log._7_1_ = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_298);
  (anonymous_namespace)::ConcurrentImageAtomicCase::genImageReadSource_abi_cxx11_(&local_2e0,this);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_2c0,&local_2e0);
  pPVar8 = glu::ProgramSources::operator<<(&local_298,&local_2c0);
  glu::ShaderProgram::ShaderProgram(pSVar7,pRVar5,pPVar8);
  section.m_log._7_1_ = 0;
  this->m_imageReadProgram = pSVar7;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  glu::ProgramSources::~ProgramSources(&local_298);
  bVar2 = glu::ShaderProgram::isOk(this->m_imageReadProgram);
  if (!bVar2) {
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"ImageReadProgram",&local_311);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"Image read program",&local_339);
    tcu::ScopedLogSection::ScopedLogSection(&local_2f0,pTVar9,&local_310,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(pTVar9,this->m_imageReadProgram);
    local_362 = 1;
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"could not build program",&local_361);
    tcu::TestError::TestError(pTVar10,&local_360);
    local_362 = 0;
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  section_1.m_log._7_1_ = 1;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_438);
  (anonymous_namespace)::ConcurrentImageAtomicCase::genImageClearSource_abi_cxx11_(&local_480,this);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_460,&local_480);
  pPVar8 = glu::ProgramSources::operator<<(&local_438,&local_460);
  glu::ShaderProgram::ShaderProgram(pSVar7,pRVar5,pPVar8);
  section_1.m_log._7_1_ = 0;
  this->m_imageClearProgram = pSVar7;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  glu::ProgramSources::~ProgramSources(&local_438);
  bVar2 = glu::ShaderProgram::isOk(this->m_imageClearProgram);
  if (!bVar2) {
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"ImageClearProgram",&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"Image read program",&local_4d9);
    tcu::ScopedLogSection::ScopedLogSection(&local_490,pTVar9,&local_4b0,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(pTVar9,this->m_imageClearProgram);
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"could not build program",&local_501);
    tcu::TestError::TestError(pTVar10,&local_500);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return extraout_EAX;
}

Assistant:

void ConcurrentImageAtomicCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	std::vector<deUint32>	zeroData			(m_workSize * m_workSize, 0);
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic");

	// gen image

	gl.genTextures(1, &m_imageID);
	gl.bindTexture(GL_TEXTURE_2D, m_imageID);
	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_workSize, m_workSize);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

	// gen buffers

	for (int ndx = 0; ndx < m_numCalls; ++ndx)
	{
		deUint32 buffer = 0;

		gl.genBuffers(1, &buffer);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32) * m_workSize * m_workSize, &zeroData[0], GL_DYNAMIC_COPY);

		m_intermediateResultBuffers.push_back(buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");
	}

	// gen programs

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource()));
	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		throw tcu::TestError("could not build program");

	m_imageReadProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genImageReadSource()));
	if (!m_imageReadProgram->isOk())
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ImageReadProgram", "Image read program");

		m_testCtx.getLog() << *m_imageReadProgram;
		throw tcu::TestError("could not build program");
	}

	m_imageClearProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genImageClearSource()));
	if (!m_imageClearProgram->isOk())
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ImageClearProgram", "Image read program");

		m_testCtx.getLog() << *m_imageClearProgram;
		throw tcu::TestError("could not build program");
	}
}